

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

iterator __thiscall
QMultiMap<QGraphicsItem_*,_QGraphicsItem_*>::insert
          (QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *this,QGraphicsItem **key,
          QGraphicsItem **value)

{
  QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>
  *pQVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  const_iterator __position;
  long in_FS_OFFSET;
  pair<QGraphicsItem_*const,_QGraphicsItem_*> local_40;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>_>
  local_30;
  _Alloc_node local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d.ptr =
       (totally_ordered_wrapper<QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_30.d.ptr ==
       (QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>
           *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>_*>
          )(QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>
       *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>
                        *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  pQVar1 = (this->d).d.ptr;
  __position._M_node = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_40.first = *key;
  for (p_Var3 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
      p_Var3 != (_Base_ptr)0x0;
      p_Var3 = (&p_Var3->_M_left)[*(QGraphicsItem **)(p_Var3 + 1) < local_40.first]) {
    if (*(QGraphicsItem **)(p_Var3 + 1) >= local_40.first) {
      __position._M_node = p_Var3;
    }
  }
  local_28._M_t = &(pQVar1->m)._M_t;
  local_40.second = *value;
  iVar2 = std::
          _Rb_tree<QGraphicsItem*,std::pair<QGraphicsItem*const,QGraphicsItem*>,std::_Select1st<std::pair<QGraphicsItem*const,QGraphicsItem*>>,std::less<QGraphicsItem*>,std::allocator<std::pair<QGraphicsItem*const,QGraphicsItem*>>>
          ::
          _M_insert_equal_<std::pair<QGraphicsItem*const,QGraphicsItem*>,std::_Rb_tree<QGraphicsItem*,std::pair<QGraphicsItem*const,QGraphicsItem*>,std::_Select1st<std::pair<QGraphicsItem*const,QGraphicsItem*>>,std::less<QGraphicsItem*>,std::allocator<std::pair<QGraphicsItem*const,QGraphicsItem*>>>::_Alloc_node>
                    ((_Rb_tree<QGraphicsItem*,std::pair<QGraphicsItem*const,QGraphicsItem*>,std::_Select1st<std::pair<QGraphicsItem*const,QGraphicsItem*>>,std::less<QGraphicsItem*>,std::allocator<std::pair<QGraphicsItem*const,QGraphicsItem*>>>
                      *)local_28._M_t,__position,&local_40,&local_28);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)(iterator)iVar2._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key`/`value` alive across the detach
        detach();
        // note that std::multimap inserts at the end of an equal_range for a key,
        // QMultiMap at the beginning.
        auto i = d->m.lower_bound(key);
        return iterator(d->m.insert(i, {key, value}));
    }